

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::negI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  unary<16,_&wasm::Literal::getLanesUI8x16,_&wasm::Literal::neg>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::negI8x16() const {
  return unary<16, &Literal::getLanesUI8x16, &Literal::neg>(*this);
}